

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O2

void __thiscall
kj::_::Debug::logInternal
          (Debug *this,char *file,int line,LogSeverity severity,char *macroArgs,
          ArrayPtr<kj::String> argValues)

{
  ArrayPtr<kj::String> argValues_00;
  ExceptionCallback *pEVar1;
  size_t sVar2;
  size_t extraout_RDX;
  String *in_R9;
  String *sysErrorString;
  StringPtr SVar3;
  size_t in_stack_ffffffffffffff98;
  Array<char> local_48;
  
  sysErrorString = in_R9;
  pEVar1 = getExceptionCallback();
  sVar2 = strlen((char *)this);
  SVar3.content.size_ = extraout_RDX;
  SVar3.content.ptr = (char *)(sVar2 + 1);
  SVar3 = trimSourceFilename((kj *)this,SVar3);
  argValues_00.size_ = in_stack_ffffffffffffff98;
  argValues_00.ptr = in_R9;
  anon_unknown_2::makeDescriptionImpl
            ((String *)&local_48,(anon_unknown_2 *)0x0,LOG,(char *)0x0,severity,
             (char *)sysErrorString,macroArgs,argValues_00);
  (*pEVar1->_vptr_ExceptionCallback[4])
            (pEVar1,(ulong)(uint)line,SVar3.content.ptr,(ulong)file & 0xffffffff,0,&local_48);
  Array<char>::~Array(&local_48);
  return;
}

Assistant:

void Debug::logInternal(const char* file, int line, LogSeverity severity, const char* macroArgs,
                        ArrayPtr<String> argValues) {
  getExceptionCallback().logMessage(severity, trimSourceFilename(file).cStr(), line, 0,
      makeDescriptionImpl(LOG, nullptr, 0, nullptr, macroArgs, argValues));
}